

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *t_00;
  Table *events;
  global_State *pgVar1;
  Value *pVVar2;
  int iVar3;
  TValue *pTVar4;
  Value *pVVar5;
  GCObject *o;
  int iVar6;
  TValue *o1;
  StkId pTVar7;
  TValue *o2_1;
  int *piVar8;
  int iVar9;
  TValue temp;
  Value local_40;
  int local_38 [2];
  
  iVar6 = t->tt;
  iVar9 = 100;
  piVar8 = &t->tt;
  do {
    if (iVar6 == 5) {
      t_00 = *(GCObject **)t;
      pTVar4 = luaH_set(L,&t_00->h,key);
      if (((pTVar4->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
         ((events->flags & 2) != 0)) {
LAB_0010738a:
        pTVar4->value = val->value;
        iVar6 = val->tt;
        pTVar4->tt = iVar6;
        (t_00->h).flags = '\0';
        if (((3 < iVar6) && (((((val->value).gc)->gch).marked & 3) != 0)) &&
           (((t_00->gch).marked & 4) != 0)) {
          pgVar1 = L->l_G;
          (t_00->gch).marked = (t_00->gch).marked & 0xfb;
          (t_00->h).gclist = pgVar1->grayagain;
          pgVar1->grayagain = t_00;
        }
        return;
      }
      pVVar5 = &luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1])->value;
      if (pVVar5 == (Value *)0x0) goto LAB_0010738a;
      iVar3 = pVVar5[1].b;
    }
    else {
      pVVar5 = &luaT_gettmbyobj(L,t,TM_NEWINDEX)->value;
      iVar3 = pVVar5[1].b;
      if (pVVar5[1].b == 0) {
        luaG_runerror(L,"attempt to %s a %s value","index",luaT_typenames[iVar6]);
      }
    }
    iVar6 = iVar3;
    if (iVar6 == 6) {
      pVVar2 = &L->top->value;
      *pVVar2 = *pVVar5;
      pVVar2[1].b = pVVar5[1].b;
      pTVar7 = L->top;
      pTVar7[1].value = t->value;
      pTVar7[1].tt = *piVar8;
      pTVar7 = L->top;
      pTVar7[2].value = key->value;
      pTVar7[2].tt = key->tt;
      pTVar7 = L->top;
      pTVar7[3].value = val->value;
      pTVar7[3].tt = val->tt;
      pTVar7 = L->top;
      if ((long)L->stack_last - (long)pTVar7 < 0x41) {
        iVar6 = L->stacksize;
        iVar9 = iVar6 * 2;
        if (iVar6 < 4) {
          iVar9 = iVar6 + 4;
        }
        luaD_reallocstack(L,iVar9);
        pTVar7 = L->top;
      }
      L->top = pTVar7 + 4;
      luaD_call(L,pTVar7,0);
      return;
    }
    local_40 = *pVVar5;
    local_38[0] = iVar6;
    t = (TValue *)&local_40;
    iVar9 = iVar9 + -1;
    piVar8 = local_38;
    if (iVar9 == 0) {
      luaG_runerror(L,"loop in settable");
    }
  } while( true );
}

Assistant:

static void luaV_settable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
TValue temp;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
TValue*oldval=luaH_set(L,h,key);
if(!ttisnil(oldval)||
(tm=fasttm(L,h->metatable,TM_NEWINDEX))==NULL){
setobj(L,oldval,val);
h->flags=0;
luaC_barriert(L,h,val);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_NEWINDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTM(L,tm,t,key,val);
return;
}
setobj(L,&temp,tm);
t=&temp;
}
luaG_runerror(L,"loop in settable");
}